

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::write_vtu(ostream *stream,Mesh *mesh,Int cell_dim,TagSet *tags,bool compress)

{
  _Rb_tree_node_base *name;
  bool bVar1;
  bool bVar2;
  LO LVar3;
  Int IVar4;
  Int space_dim;
  I32 IVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  size_type sVar8;
  Tag<long> *pTVar9;
  TagBase *pTVar10;
  string *psVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  Int i_1;
  ulong uVar15;
  byte value;
  Int i;
  uint uVar16;
  int iVar17;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar18;
  undefined7 in_register_00000081;
  pointer psVar19;
  char *format;
  ScopedTimer omega_h_scoped_function_timer;
  undefined1 local_128 [48];
  Int cell_dim_local;
  allocator local_f1;
  pointer local_f0;
  Read<signed_char> types;
  Reals coords;
  LOs ends;
  LOs ev2v;
  Bytes ghost_types;
  Write<int> local_60;
  Write<double> local_50;
  Write<double> local_40;
  
  local_128._40_8_ = tags;
  cell_dim_local = cell_dim;
  std::__cxx11::string::string
            ((string *)&ghost_types,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,(allocator *)&ends);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&types,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ghost_types,
                 ":");
  std::__cxx11::to_string((string *)&ev2v,0x25c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&types,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ev2v);
  begin_code("write_vtu",(char *)local_128._0_8_);
  local_f0 = (pointer)CONCAT44(local_f0._4_4_,(int)CONCAT71(in_register_00000081,compress));
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)&ev2v);
  std::__cxx11::string::~string((string *)&types);
  std::__cxx11::string::~string((string *)&ghost_types);
  default_dim(mesh,&cell_dim_local);
  local_128._32_8_ = ZEXT48((uint)cell_dim_local);
  for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
    if (uVar15 == 0 || uVar15 == local_128._32_8_) {
      psVar18 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128._40_8_;
      for (p_Var6 = ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_128._40_8_)[uVar15]._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var6 != &psVar18[uVar15]._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        name = p_Var6 + 1;
        bVar1 = Omega_h::Mesh::has_tag(mesh,(Int)uVar15,(string *)name);
        if ((((!bVar1) &&
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)name,"local"), bVar1)) &&
            (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)name,"owner"), bVar1)) &&
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)name,"vtkGhostType"), bVar1)) {
          pcVar12 = *(char **)name;
          format = 
          "User requested VTK output of tag %s on %s, but that tag doesn\'t exist on the mesh!";
          goto LAB_0035e373;
        }
      }
    }
    else if (((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128._40_8_)[uVar15]._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pcVar12 = dimensional_plural_name((Int)uVar15);
      format = "User requested VTK output of tags on %s, but only vertices and %s are output!";
      uVar15 = local_128._32_8_;
LAB_0035e373:
      pcVar13 = dimensional_plural_name((Int)uVar15);
      fail(format,pcVar12,pcVar13);
    }
  }
  bVar1 = local_f0._0_1_;
  write_vtkfile_vtu_start_tag(stream,local_f0._0_1_);
  std::operator<<(stream,"<UnstructuredGrid>\n");
  IVar4 = cell_dim_local;
  psVar19 = (pointer)(ulong)(uint)cell_dim_local;
  poVar7 = std::operator<<(stream,"<Piece NumberOfPoints=\"");
  LVar3 = Omega_h::Mesh::nverts(mesh);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,LVar3);
  std::operator<<(poVar7,"\"");
  poVar7 = std::operator<<(stream," NumberOfCells=\"");
  LVar3 = Omega_h::Mesh::nents(mesh,IVar4);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,LVar3);
  std::operator<<(poVar7,"\">\n");
  std::operator<<(stream,"<Cells>\n");
  LVar3 = Omega_h::Mesh::nents(mesh,IVar4);
  local_128._32_8_ = SEXT48(IVar4);
  uVar14 = IVar4 - 1;
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    if (uVar14 < 3) {
      uVar16 = 0xa0503;
      goto LAB_0035dbd8;
    }
    bVar2 = psVar19 != (pointer)0x0;
LAB_0035dbef:
    value = -bVar2 | 1;
  }
  else {
    if (2 < uVar14) {
      bVar2 = IVar4 != 0;
      goto LAB_0035dbef;
    }
    uVar16 = 0xc0903;
LAB_0035dbd8:
    value = (byte)(uVar16 >> ((char)uVar14 * '\b' & 0x1fU));
  }
  std::__cxx11::string::string((string *)local_128,"",(allocator *)&ghost_types);
  Read<signed_char>::Read(&types,LVar3,value,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::string((string *)local_128,"types",(allocator *)&ev2v);
  Write<signed_char>::Write(&ghost_types.write_,&types.write_);
  write_array<signed_char,signed_char>(stream,(string *)local_128,1,&ghost_types,bVar1);
  Write<signed_char>::~Write(&ghost_types.write_);
  std::__cxx11::string::~string((string *)local_128);
  Omega_h::Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    iVar17 = -1;
    if ((uint)local_128._32_8_ < 4) {
      iVar17 = IVar4 + 1;
    }
  }
  else if ((uint)IVar4 < 4) {
    iVar17 = *(int *)(&DAT_00377770 + (long)psVar19 * 4);
  }
  else {
    iVar17 = -1;
  }
  LVar3 = Omega_h::Mesh::nents(mesh,(uint)local_128._32_8_);
  std::__cxx11::string::string((string *)local_128,"",(allocator *)&coords);
  Read<int>::Read(&ends,LVar3,iVar17,iVar17,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::string((string *)local_128,"connectivity",(allocator *)&local_60);
  Write<int>::Write((Write<int> *)&coords,&ev2v.write_);
  write_array<int,int>(stream,(string *)local_128,1,(Read<int> *)&coords,bVar1);
  Write<int>::~Write((Write<int> *)&coords);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::string((string *)local_128,"offsets",&local_f1);
  Write<int>::Write(&local_60,&ends.write_);
  write_array<int,int>(stream,(string *)local_128,1,(Read<int> *)&local_60,bVar1);
  Write<int>::~Write(&local_60);
  std::__cxx11::string::~string((string *)local_128);
  Write<int>::~Write(&ends.write_);
  Write<int>::~Write(&ev2v.write_);
  Write<signed_char>::~Write(&types.write_);
  std::operator<<(stream,"</Cells>\n");
  std::operator<<(stream,"<Points>\n");
  Omega_h::Mesh::coords((Mesh *)&coords);
  std::__cxx11::string::string((string *)local_128,"coordinates",(allocator *)&types);
  Write<double>::Write(&local_50,&coords.write_);
  IVar4 = Omega_h::Mesh::dim(mesh);
  resize_vectors((Omega_h *)&local_40,(Reals *)&local_50,IVar4,3);
  local_f0 = psVar19;
  write_array<double,double>(stream,(string *)local_128,3,(Read<double> *)&local_40,bVar1);
  Write<double>::~Write(&local_40);
  Write<double>::~Write(&local_50);
  std::__cxx11::string::~string((string *)local_128);
  std::operator<<(stream,"</Points>\n");
  std::operator<<(stream,"<PointData>\n");
  std::__cxx11::string::string((string *)local_128,"global",(allocator *)&ghost_types);
  bVar2 = Omega_h::Mesh::has_tag(mesh,0,(string *)local_128);
  if (bVar2) {
    std::__cxx11::string::string((string *)&types,"global",(allocator *)&ev2v);
    sVar8 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128._40_8_,(key_type *)&types);
    std::__cxx11::string::~string((string *)&types);
    std::__cxx11::string::~string((string *)local_128);
    if (sVar8 != 0) {
      std::__cxx11::string::string((string *)local_128,"global",(allocator *)&types);
      pTVar9 = Omega_h::Mesh::get_tag<long>(mesh,0,(string *)local_128);
      IVar4 = Omega_h::Mesh::dim(mesh);
      write_tag(stream,&pTVar9->super_TagBase,IVar4,bVar1);
      goto LAB_0035df81;
    }
  }
  else {
LAB_0035df81:
    std::__cxx11::string::~string((string *)local_128);
  }
  write_locals_and_owners(stream,mesh,0,(TagSet *)local_128._40_8_,bVar1);
  for (iVar17 = 0; IVar4 = Omega_h::Mesh::ntags(mesh,0), iVar17 < IVar4; iVar17 = iVar17 + 1) {
    pTVar10 = Omega_h::Mesh::get_tag(mesh,0,iVar17);
    psVar11 = TagBase::name_abi_cxx11_(pTVar10);
    bVar2 = std::operator!=(psVar11,"coordinates");
    if (bVar2) {
      psVar11 = TagBase::name_abi_cxx11_(pTVar10);
      bVar2 = std::operator!=(psVar11,"global");
      if (bVar2) {
        psVar11 = TagBase::name_abi_cxx11_(pTVar10);
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_128._40_8_,psVar11);
        if (sVar8 != 0) {
          IVar4 = Omega_h::Mesh::dim(mesh);
          write_tag(stream,pTVar10,IVar4,bVar1);
        }
      }
    }
  }
  std::operator<<(stream,"</PointData>\n");
  std::operator<<(stream,"<CellData>\n");
  std::__cxx11::string::string((string *)local_128,"global",(allocator *)&ghost_types);
  IVar4 = (Int)local_f0;
  bVar2 = Omega_h::Mesh::has_tag(mesh,IVar4,(string *)local_128);
  if (bVar2) {
    std::__cxx11::string::string((string *)&types,"global",(allocator *)&ev2v);
    sVar8 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128._40_8_ + local_128._32_8_,(key_type *)&types);
    std::__cxx11::string::~string((string *)&types);
    std::__cxx11::string::~string((string *)local_128);
    if (sVar8 == 0) goto LAB_0035e123;
    std::__cxx11::string::string((string *)local_128,"global",(allocator *)&types);
    pTVar9 = Omega_h::Mesh::get_tag<long>(mesh,(Int)local_128._32_8_,(string *)local_128);
    space_dim = Omega_h::Mesh::dim(mesh);
    write_tag(stream,&pTVar9->super_TagBase,space_dim,bVar1);
  }
  std::__cxx11::string::~string((string *)local_128);
LAB_0035e123:
  write_locals_and_owners(stream,mesh,IVar4,(TagSet *)local_128._40_8_,bVar1);
  std::__cxx11::string::string((string *)local_128,"vtkGhostType",(allocator *)&types);
  psVar18 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128._40_8_ + local_128._32_8_;
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(psVar18,(key_type *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  if (sVar8 != 0) {
    Omega_h::Mesh::comm((Mesh *)local_128);
    IVar5 = Comm::size((Comm *)local_128._0_8_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    if (IVar5 != 1) {
      Omega_h::Mesh::owned((Mesh *)&types,(Int)mesh);
      Write<signed_char>::Write((Write<signed_char> *)&ev2v,&types.write_);
      each_eq_to<signed_char>((Omega_h *)&ghost_types,(Read<signed_char> *)&ev2v,'\0');
      Write<signed_char>::~Write((Write<signed_char> *)&ev2v);
      std::__cxx11::string::string((string *)local_128,"vtkGhostType",(allocator *)&local_60);
      Write<signed_char>::Write((Write<signed_char> *)&ends,&ghost_types.write_);
      write_array<signed_char,unsigned_char>
                (stream,(string *)local_128,1,(Read<signed_char> *)&ends,bVar1);
      Write<signed_char>::~Write((Write<signed_char> *)&ends);
      std::__cxx11::string::~string((string *)local_128);
      Write<signed_char>::~Write(&ghost_types.write_);
      Write<signed_char>::~Write(&types.write_);
    }
  }
  for (iVar17 = 0; IVar4 = Omega_h::Mesh::ntags(mesh,(Int)local_128._32_8_), iVar17 < IVar4;
      iVar17 = iVar17 + 1) {
    pTVar10 = Omega_h::Mesh::get_tag(mesh,(Int)local_f0,iVar17);
    psVar11 = TagBase::name_abi_cxx11_(pTVar10);
    bVar2 = std::operator!=(psVar11,"global");
    if (bVar2) {
      psVar11 = TagBase::name_abi_cxx11_(pTVar10);
      sVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(psVar18,psVar11);
      if (sVar8 != 0) {
        IVar4 = Omega_h::Mesh::dim(mesh);
        write_tag(stream,pTVar10,IVar4,bVar1);
      }
    }
  }
  std::operator<<(stream,"</CellData>\n");
  std::operator<<(stream,"</Piece>\n");
  std::operator<<(stream,"</UnstructuredGrid>\n");
  std::operator<<(stream,"</VTKFile>\n");
  Write<double>::~Write(&coords.write_);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void write_vtu(std::ostream& stream, Mesh* mesh, Int cell_dim,
    TagSet const& tags, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  default_dim(mesh, &cell_dim);
  verify_vtk_tagset(mesh, cell_dim, tags);
  write_vtkfile_vtu_start_tag(stream, compress);
  stream << "<UnstructuredGrid>\n";
  write_piece_start_tag(stream, mesh, cell_dim);
  stream << "<Cells>\n";
  write_connectivity(stream, mesh, cell_dim, compress);
  stream << "</Cells>\n";
  stream << "<Points>\n";
  auto coords = mesh->coords();
  write_array(stream, "coordinates", 3, resize_vectors(coords, mesh->dim(), 3),
      compress);
  stream << "</Points>\n";
  stream << "<PointData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(VERT, "global") && tags[VERT].count("global")) {
    write_tag(stream, mesh->get_tag<GO>(VERT, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, VERT, tags, compress);
  for (Int i = 0; i < mesh->ntags(VERT); ++i) {
    auto tag = mesh->get_tag(VERT, i);
    if (tag->name() != "coordinates" && tag->name() != "global" &&
        tags[VERT].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</PointData>\n";
  stream << "<CellData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(cell_dim, "global") &&
      tags[size_t(cell_dim)].count("global")) {
    write_tag(
        stream, mesh->get_tag<GO>(cell_dim, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, cell_dim, tags, compress);
  if (tags[size_t(cell_dim)].count("vtkGhostType")) {
    write_vtk_ghost_types(stream, mesh, cell_dim, compress);
  }
  for (Int i = 0; i < mesh->ntags(cell_dim); ++i) {
    auto tag = mesh->get_tag(cell_dim, i);
    if (tag->name() != "global" && tags[size_t(cell_dim)].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</CellData>\n";
  stream << "</Piece>\n";
  stream << "</UnstructuredGrid>\n";
  stream << "</VTKFile>\n";
}